

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_head.h
# Opt level: O2

void anon_unknown.dwarf_6899d::buildAndAssert_Elements_Multiple(int elements)

{
  ulong uVar1;
  cell cVar2;
  uint tmpCol;
  uint uVar3;
  uint column_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  char *in_R9;
  uint row;
  uint column;
  uint uVar4;
  uint row_00;
  AssertionResult gtest_ar__2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> elements_1;
  AssertHelper local_140;
  int local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  ulong local_128;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertHelper local_d0;
  SudokuGitter gitter;
  SudokuGitter local_a0;
  SudokuGenerator generator;
  
  uVar1 = (ulong)(uint)elements;
  local_128 = (ulong)SQRT((double)uVar1);
  local_138 = 0;
  do {
    if (local_138 == 10) {
      return;
    }
    SudokuGenerator::SudokuGenerator(&generator,elements);
    SudokuGenerator::generateNew(&gitter,&generator);
    SudokuGitter::SudokuGitter(&local_a0,&gitter);
    for (uVar3 = 0; uVar4 = elements, uVar3 != elements; uVar3 = uVar3 + 1) {
      elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &elements_1._M_t._M_impl.super__Rb_tree_header._M_header;
      elements_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (uVar4 = 0; elements != uVar4; uVar4 = uVar4 + 1) {
        cVar2 = SudokuGitter::getCell(&local_a0,uVar3,uVar4);
        gtest_ar__1._0_4_ = cVar2.value;
        gtest_ar__1._4_1_ = cVar2.isStatic;
        if (gtest_ar__1._0_4_ != 0) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&elements_1,(uint *)&gtest_ar__1);
        }
      }
      if (elements_1._M_t._M_impl.super__Rb_tree_header._M_node_count != uVar1) {
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&elements_1);
        uVar4 = uVar3;
        break;
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::clear((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&elements_1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&elements_1);
    }
    gtest_ar_.success_ = (uint)elements <= uVar4;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::~vector(&local_a0.cells);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&elements_1,(internal *)&gtest_ar_,
                 (AssertionResult *)"checkRows(gitter, size)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                 ,0x61,(char *)elements_1._M_t._M_impl._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      std::__cxx11::string::~string((string *)&elements_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__1);
      this = &gtest_ar_.message_;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      SudokuGitter::SudokuGitter((SudokuGitter *)&gtest_ar_,&gitter);
      for (uVar3 = 0; uVar4 = elements, uVar3 != elements; uVar3 = uVar3 + 1) {
        elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &elements_1._M_t._M_impl.super__Rb_tree_header._M_header;
        elements_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (uVar4 = 0; elements != uVar4; uVar4 = uVar4 + 1) {
          cVar2 = SudokuGitter::getCell((SudokuGitter *)&gtest_ar_,uVar4,uVar3);
          if (cVar2.value != 0) {
            gtest_ar__2._0_4_ = cVar2.value;
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>
                      ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)&elements_1,(int *)&gtest_ar__2);
          }
        }
        if (elements_1._M_t._M_impl.super__Rb_tree_header._M_node_count != uVar1) {
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&elements_1);
          uVar4 = uVar3;
          break;
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &elements_1);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &elements_1);
      }
      gtest_ar__1.success_ = (uint)elements <= uVar4;
      gtest_ar__1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::
      vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
      ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                 *)&gtest_ar_);
      if (gtest_ar__1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&elements_1,(internal *)&gtest_ar__1,
                   (AssertionResult *)"checkColumns(gitter, size)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_140,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                   ,0x62,(char *)elements_1._M_t._M_impl._0_8_);
        testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper(&local_140);
        std::__cxx11::string::~string((string *)&elements_1);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__2);
        this = &gtest_ar__1.message_;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__1.message_);
        SudokuGitter::SudokuGitter((SudokuGitter *)&gtest_ar__1,&gitter);
        local_134 = (uint)elements / (uint)local_128;
        for (uVar3 = 0; uVar4 = elements, uVar3 != elements; uVar3 = uVar3 + 1) {
          elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &elements_1._M_t._M_impl.super__Rb_tree_header._M_header;
          elements_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_12c = (uVar3 * local_134) % (uint)elements;
          row_00 = uVar3 - (int)((ulong)uVar3 % (local_128 & 0xffffffff));
          local_130 = row_00 + (int)local_128;
          uVar4 = local_12c + local_134;
          elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               elements_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (; column_00 = local_12c, row_00 < local_130; row_00 = row_00 + 1) {
            for (; column_00 < uVar4; column_00 = column_00 + 1) {
              cVar2 = SudokuGitter::getCell((SudokuGitter *)&gtest_ar__1,row_00,column_00);
              if (cVar2.value != 0) {
                local_140.data_._0_4_ = cVar2.value;
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _M_insert_unique<int>
                          ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            *)&elements_1,(int *)&local_140);
              }
            }
          }
          if (elements_1._M_t._M_impl.super__Rb_tree_header._M_node_count != uVar1) {
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&elements_1);
            uVar4 = uVar3;
            break;
          }
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)&elements_1);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )&elements_1);
        }
        gtest_ar__2.success_ = (uint)elements <= uVar4;
        gtest_ar__2.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::
        vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
        ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                   *)&gtest_ar__1);
        if (uVar4 < (uint)elements) {
          testing::Message::Message((Message *)&local_140);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&elements_1,(internal *)&gtest_ar__2,
                     (AssertionResult *)"checkQuad(gitter, size)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                     ,99,(char *)elements_1._M_t._M_impl._0_8_);
          testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_140);
          testing::internal::AssertHelper::~AssertHelper(&local_d0);
          std::__cxx11::string::~string((string *)&elements_1);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_140);
        }
        this = &gtest_ar__2.message_;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(this);
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::~vector(&gitter.cells);
    SudokuGenerator::~SudokuGenerator(&generator);
    local_138 = local_138 + 1;
  } while( true );
}

Assistant:

static void buildAndAssert_Elements_Multiple(int elements) {
        for (unsigned int run = 0; run < RUNS; run++) {
            buildAndAssert_Elements(elements);
        }
    }